

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O0

Stream * rw::readSkinSplitData(Stream *stream,Skin *skin)

{
  int32 iVar1;
  uint uVar2;
  int8 *piVar3;
  int8 *data;
  uint32 sz;
  Skin *skin_local;
  Stream *stream_local;
  
  iVar1 = Stream::readI32(stream);
  skin->boneLimit = iVar1;
  iVar1 = Stream::readI32(stream);
  skin->numMeshes = iVar1;
  iVar1 = Stream::readI32(stream);
  skin->rleSize = iVar1;
  if (skin->numMeshes != 0) {
    uVar2 = skin->numBones + (skin->numMeshes + skin->rleSize) * 2;
    piVar3 = (int8 *)malloc_LOC((ulong)uVar2,0x30116,
                                "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/skin.cpp line: 86"
                               );
    (*stream->_vptr_Stream[4])(stream,piVar3,(ulong)uVar2);
    skin->remapIndices = piVar3;
    skin->rleCount = (RLEcount *)(piVar3 + skin->numBones);
    skin->rle = (RLE *)(piVar3 + (long)(skin->numMeshes << 1) + (long)skin->numBones);
  }
  return stream;
}

Assistant:

Stream*
readSkinSplitData(Stream *stream, Skin *skin)
{
	uint32 sz;
	int8 *data;

	skin->boneLimit = stream->readI32();
	skin->numMeshes = stream->readI32();
	skin->rleSize = stream->readI32();
	if(skin->numMeshes){
		sz = skin->numBones + 2*(skin->numMeshes+skin->rleSize);
		data = (int8*)rwMalloc(sz, MEMDUR_EVENT | ID_SKIN);
		stream->read8(data, sz);
		skin->remapIndices = data;
		skin->rleCount = (Skin::RLEcount*)(data + skin->numBones);
		skin->rle = (Skin::RLE*)(data + skin->numBones + 2*skin->numMeshes);
	}
	return stream;
}